

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re_search.c
# Opt level: O2

int re_forwsrch(void)

{
  mgwin *pmVar1;
  int iVar2;
  char *__string;
  line *plVar3;
  int iVar4;
  
  plVar3 = curwp->w_dotp;
  iVar2 = curwp->w_doto;
  iVar4 = curwp->w_dotline;
  if (iVar2 != plVar3->l_used) goto LAB_00114155;
  if (iVar2 == 0) goto LAB_00114155;
  if (plVar3 == curbp->b_headp) goto LAB_00114155;
  do {
    plVar3 = plVar3->l_fp;
    iVar4 = iVar4 + 1;
    iVar2 = 0;
LAB_00114155:
    if (plVar3 == curbp->b_headp) {
      return 0;
    }
    regex_match[0].rm_eo = plVar3->l_used;
    __string = "";
    if (plVar3->l_text != (char *)0x0) {
      __string = plVar3->l_text;
    }
    regex_match[0].rm_so = iVar2;
    iVar2 = regexec((regex_t *)&regex_buff,__string,10,(regmatch_t *)regex_match,
                    5 - (uint)(iVar2 == 0));
    pmVar1 = curwp;
  } while (iVar2 != 0);
  curwp->w_doto = regex_match[0].rm_eo;
  pmVar1->w_dotp = plVar3;
  pmVar1->w_dotline = iVar4;
  pmVar1->w_rflag = pmVar1->w_rflag | 2;
  return 1;
}

Assistant:

static int
re_forwsrch(void)
{
	int	 	 re_flags, tbo, tdotline, error;
	struct line	*clp;

	clp = curwp->w_dotp;
	tbo = curwp->w_doto;
	tdotline = curwp->w_dotline;

	if (tbo == clp->l_used)
		/*
		 * Don't start matching past end of line -- must move to
		 * beginning of next line, unless line is empty or at
		 * end of file.
		 */
		if (clp != curbp->b_headp && llength(clp) != 0) {
			clp = lforw(clp);
			tdotline++;
			tbo = 0;
		}
	/*
	 * Note this loop does not process the last line, but this editor
	 * always makes the last line empty so this is good.
	 */
	while (clp != (curbp->b_headp)) {
		re_flags = REG_STARTEND;
		if (tbo != 0)
			re_flags |= REG_NOTBOL;
		regex_match[0].rm_so = tbo;
		regex_match[0].rm_eo = llength(clp);
		error = regexec(&regex_buff, ltext(clp) ? ltext(clp) : "",
		    RE_NMATCH, regex_match, re_flags);
		if (error != 0) {
			clp = lforw(clp);
			tdotline++;
			tbo = 0;
		} else {
			curwp->w_doto = regex_match[0].rm_eo;
			curwp->w_dotp = clp;
			curwp->w_dotline = tdotline;
			curwp->w_rflag |= WFMOVE;
			return (TRUE);
		}
	}
	return (FALSE);
}